

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

int cpu_ldsw_data_ra_mipsel(CPUArchState_conflict8 *env,target_ulong_conflict ptr,uintptr_t retaddr)

{
  int iVar1;
  uint mmu_idx;
  
  mmu_idx = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    mmu_idx = env->hflags & 3;
  }
  iVar1 = cpu_ldsw_mmuidx_ra_mipsel(env,ptr,mmu_idx,retaddr);
  return iVar1;
}

Assistant:

int cpu_ldsw_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldsw_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}